

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_of_detail.c
# Opt level: O3

void prf_level_of_detail_entry_f(prf_node_t *node,prf_state_t *state)

{
  if (node->opcode == prf_level_of_detail_info.opcode) {
    return;
  }
  prf_error(9,"level of detail entry state method on node of type %d.");
  return;
}

Assistant:

static void
prf_level_of_detail_entry_f(prf_node_t * node,
                            prf_state_t * state)
{
  assert((node != NULL) && (state != NULL));

  if (node->opcode != prf_level_of_detail_info.opcode) {
    prf_error(9, "level of detail entry state method on node of type %d.",
              node->opcode);
    return;
  }
  /* do nothing ? */
}